

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlElementPtr pxVar1;
  _xmlElementContent *p_Var2;
  uint uVar3;
  uint in_EAX;
  int iVar4;
  uint uVar5;
  uint uVar6;
  xmlNodePtr node;
  xmlValidState *pxVar7;
  xmlRegExecCtxtPtr pxVar8;
  xmlChar *pxVar9;
  uint uVar10;
  ulong uVar11;
  _xmlElementContent *p_Var12;
  xmlRegexpPtr comp;
  xmlChar *str1;
  int local_38;
  int extsubset;
  
  _local_38 = (ulong)in_EAX;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  uVar6 = 1;
  if (((ctxt->vstateNr < 1) || (pxVar7 = ctxt->vstate, pxVar7 == (xmlValidState *)0x0)) ||
     (pxVar1 = pxVar7->elemDecl, pxVar1 == (xmlElementPtr)0x0)) goto switchD_0015b511_caseD_2;
  switch(pxVar1->etype) {
  case XML_ELEMENT_TYPE_UNDEFINED:
  case XML_ELEMENT_TYPE_EMPTY:
switchD_0015b511_caseD_0:
    uVar6 = 0;
    break;
  case XML_ELEMENT_TYPE_MIXED:
    p_Var12 = pxVar1->content;
    if (p_Var12 == (xmlElementContentPtr)0x0) {
      xmlSplitQName3(qname,&stack0xffffffffffffffc8);
      goto switchD_0015b511_caseD_0;
    }
    uVar6 = 0;
    if (p_Var12->type != XML_ELEMENT_CONTENT_PCDATA) {
      pxVar9 = xmlSplitQName3(qname,&stack0xffffffffffffffc8);
      if (pxVar9 == (xmlChar *)0x0) {
        do {
          uVar6 = 0;
          if (p_Var12->type == XML_ELEMENT_CONTENT_OR) {
            p_Var2 = p_Var12->c1;
            if (p_Var2 == (_xmlElementContent *)0x0) break;
            if (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA) {
              if (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT) break;
              if (p_Var2->prefix == (xmlChar *)0x0) {
                pxVar9 = p_Var2->name;
                goto LAB_0015b71e;
              }
            }
          }
          else {
            if (p_Var12->type != XML_ELEMENT_CONTENT_ELEMENT) break;
            if (p_Var12->prefix == (xmlChar *)0x0) {
              pxVar9 = p_Var12->name;
LAB_0015b71e:
              iVar4 = xmlStrEqual(pxVar9,qname);
              if (iVar4 != 0) goto LAB_0015b82b;
            }
          }
          p_Var12 = p_Var12->c2;
        } while (p_Var12 != (_xmlElementContent *)0x0);
      }
      else {
LAB_0015b647:
        if (p_Var12->type == XML_ELEMENT_CONTENT_OR) {
          p_Var2 = p_Var12->c1;
          if (p_Var2 == (_xmlElementContent *)0x0) goto LAB_0015b7f4;
          if (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA) {
            if (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_0015b7f4;
            if ((p_Var2->prefix != (xmlChar *)0x0) &&
               (iVar4 = xmlStrncmp(p_Var2->prefix,qname,local_38), iVar4 == 0)) {
              str1 = p_Var12->c1->name;
              goto LAB_0015b6b3;
            }
          }
LAB_0015b6c3:
          p_Var12 = p_Var12->c2;
          if (p_Var12 == (_xmlElementContent *)0x0) goto switchD_0015b511_caseD_0;
          goto LAB_0015b647;
        }
        if (p_Var12->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_0015b7f4:
          uVar6 = 0;
          xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_DTD_MIXED_CORRUPT,2,(xmlChar *)0x0,(xmlChar *)0x0,
                        (xmlChar *)0x0,0,"Internal: MIXED struct corrupted\n",0);
          break;
        }
        if ((p_Var12->prefix == (xmlChar *)0x0) ||
           (iVar4 = xmlStrncmp(p_Var12->prefix,qname,local_38), iVar4 != 0)) goto LAB_0015b6c3;
        str1 = p_Var12->name;
LAB_0015b6b3:
        iVar4 = xmlStrEqual(str1,pxVar9);
        if (iVar4 == 0) goto LAB_0015b6c3;
LAB_0015b82b:
        uVar6 = 1;
      }
    }
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if (pxVar7->exec == (xmlRegExecCtxtPtr)0x0) break;
    uVar6 = 0;
    uVar5 = xmlRegExecPushString(pxVar7->exec,qname,(void *)0x0);
    if (uVar5 != 0xfffffffb) {
      uVar6 = ~uVar5 >> 0x1f;
      break;
    }
    goto LAB_0015b609;
  }
switchD_0015b511_caseD_2:
  node = (xmlNodePtr)xmlValidGetElemDecl(ctxt,doc,elem,&extsubset);
  iVar4 = ctxt->vstateNr;
  uVar5 = ctxt->vstateMax;
  if (iVar4 < (int)uVar5) {
    pxVar7 = ctxt->vstateTab;
LAB_0015b598:
    pxVar7 = pxVar7 + iVar4;
    ctxt->vstate = pxVar7;
    pxVar7->elemDecl = (xmlElementPtr)node;
    pxVar7->node = elem;
    if ((node != (xmlNodePtr)0x0) && (*(int *)&node->ns == 4)) {
      comp = (xmlRegexpPtr)node->psvi;
      if (comp == (xmlRegexpPtr)0x0) {
        xmlValidBuildContentModel(ctxt,(xmlElementPtr)node);
        comp = (xmlRegexpPtr)node->psvi;
        if (comp == (xmlRegexpPtr)0x0) {
          ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
          xmlDoErrValid(ctxt,node,XML_ERR_INTERNAL_ERROR,2,elem->name,(xmlChar *)0x0,(xmlChar *)0x0,
                        0,"Failed to build content model regexp for %s\n",elem->name,0,0);
          iVar4 = ctxt->vstateNr;
          goto LAB_0015b7cd;
        }
      }
      pxVar8 = xmlRegNewExecCtxt(comp,(xmlRegExecCallbacks)0x0,(void *)0x0);
      iVar4 = ctxt->vstateNr;
      ctxt->vstateTab[iVar4].exec = pxVar8;
      if (pxVar8 == (xmlRegExecCtxtPtr)0x0) goto LAB_0015b609;
    }
LAB_0015b7cd:
    ctxt->vstateNr = iVar4 + 1;
  }
  else {
    if ((int)uVar5 < 1) {
      uVar11 = 10;
LAB_0015b572:
      pxVar7 = (xmlValidState *)(*xmlRealloc)(ctxt->vstateTab,uVar11 * 0x18);
      if (pxVar7 != (xmlValidState *)0x0) {
        ctxt->vstateTab = pxVar7;
        ctxt->vstateMax = (int)uVar11;
        iVar4 = ctxt->vstateNr;
        goto LAB_0015b598;
      }
    }
    else if (uVar5 < 1000000000) {
      uVar10 = uVar5 + 1 >> 1;
      uVar3 = uVar10 + uVar5;
      if (1000000000 - uVar10 < uVar5) {
        uVar3 = 1000000000;
      }
      uVar11 = (ulong)uVar3;
      goto LAB_0015b572;
    }
LAB_0015b609:
    xmlVErrMemory(ctxt);
  }
  return uVar6;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
                        if (ret == XML_REGEXP_OUT_OF_MEMORY) {
                            xmlVErrMemory(ctxt);
                            return(0);
                        }
			if (ret < 0) {
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}